

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

BtorSimBitVector * btorsim_bv_new(uint32_t bw)

{
  BtorSimBitVector *pBVar1;
  uint in_EDI;
  BtorSimBitVector *res;
  uint32_t i;
  size_t in_stack_ffffffffffffffe8;
  uint local_8;
  
  local_8 = in_EDI >> 5;
  if ((in_EDI & 0x1f) != 0) {
    local_8 = local_8 + 1;
  }
  pBVar1 = (BtorSimBitVector *)btorsim_malloc(in_stack_ffffffffffffffe8);
  memset(pBVar1 + 1,0,(ulong)local_8 << 2);
  pBVar1->len = local_8;
  pBVar1->width = in_EDI;
  return pBVar1;
}

Assistant:

BtorSimBitVector *
btorsim_bv_new (uint32_t bw)
{
  assert (bw > 0);

  uint32_t i;
  BtorSimBitVector *res;

  i = bw / BTORSIM_BV_TYPE_BW;
  if (bw % BTORSIM_BV_TYPE_BW > 0) i += 1;

  assert (i > 0);
  res =
      btorsim_malloc (sizeof (BtorSimBitVector) + sizeof (BTORSIM_BV_TYPE) * i);
  memset (res->bits, 0, i * sizeof *(res->bits));
  res->len = i;
  assert (res->len);
  res->width = bw;
  return res;
}